

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  int iVar1;
  uint uVar2;
  enet_uint32 eVar3;
  ulong uVar4;
  size_t sVar5;
  enet_uint32 *peVar6;
  enet_uint32 local_84;
  int local_80;
  uint local_78;
  uint local_74;
  enet_uint32 *checksum;
  size_t compressedSize;
  size_t originalSize;
  size_t sStack_50;
  enet_uint32 packetLoss;
  size_t shouldCompress;
  ENetPeer *pEStack_40;
  int sentLength;
  ENetPeer *currentPeer;
  ENetProtocolHeader *header;
  enet_uint8 headerData [8];
  int checkForTimeouts_local;
  ENetEvent *event_local;
  ENetHost *host_local;
  
  host->continueSending = 1;
  headerData._0_4_ = checkForTimeouts;
  unique0x100006a8 = event;
  do {
    if (host->continueSending == 0) {
      return 0;
    }
    host->continueSending = 0;
    for (pEStack_40 = host->peers; pEStack_40 < host->peers + host->peerCount;
        pEStack_40 = pEStack_40 + 1) {
      if ((pEStack_40->state != ENET_PEER_STATE_DISCONNECTED) &&
         (pEStack_40->state != ENET_PEER_STATE_ZOMBIE)) {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = 4;
        if ((pEStack_40->acknowledgements).sentinel.next != &(pEStack_40->acknowledgements).sentinel
           ) {
          enet_protocol_send_acknowledgements(host,pEStack_40);
        }
        if ((((headerData._0_4_ == 0) ||
             ((pEStack_40->sentReliableCommands).sentinel.next ==
              &(pEStack_40->sentReliableCommands).sentinel)) ||
            (86399999 < host->serviceTime - pEStack_40->nextTimeout)) ||
           (iVar1 = enet_protocol_check_timeouts(host,pEStack_40,stack0xffffffffffffffe0),
           iVar1 != 1)) {
          if ((((pEStack_40->outgoingCommands).sentinel.next ==
                &(pEStack_40->outgoingCommands).sentinel) ||
              (iVar1 = enet_protocol_check_outgoing_commands(host,pEStack_40), iVar1 != 0)) &&
             ((pEStack_40->sentReliableCommands).sentinel.next ==
              &(pEStack_40->sentReliableCommands).sentinel)) {
            if (host->serviceTime - pEStack_40->lastReceiveTime < 86400000) {
              local_74 = host->serviceTime - pEStack_40->lastReceiveTime;
            }
            else {
              local_74 = pEStack_40->lastReceiveTime - host->serviceTime;
            }
            if ((pEStack_40->pingInterval <= local_74) &&
               (3 < (ulong)pEStack_40->mtu - host->packetSize)) {
              enet_peer_ping(pEStack_40);
              enet_protocol_check_outgoing_commands(host,pEStack_40);
            }
          }
          if (host->commandCount != 0) {
            if (pEStack_40->packetLossEpoch == 0) {
              pEStack_40->packetLossEpoch = host->serviceTime;
            }
            else {
              if (host->serviceTime - pEStack_40->packetLossEpoch < 86400000) {
                local_78 = host->serviceTime - pEStack_40->packetLossEpoch;
              }
              else {
                local_78 = pEStack_40->packetLossEpoch - host->serviceTime;
              }
              if ((9999 < local_78) && (pEStack_40->packetsSent != 0)) {
                uVar2 = (pEStack_40->packetsLost << 0x10) / pEStack_40->packetsSent;
                if (uVar2 < pEStack_40->packetLoss) {
                  local_80 = pEStack_40->packetLoss - uVar2;
                }
                else {
                  local_80 = uVar2 - pEStack_40->packetLoss;
                }
                pEStack_40->packetLossVariance = pEStack_40->packetLossVariance * 3 + local_80 >> 2;
                pEStack_40->packetLoss = pEStack_40->packetLoss * 7 + uVar2 >> 3;
                pEStack_40->packetLossEpoch = host->serviceTime;
                pEStack_40->packetsSent = 0;
                pEStack_40->packetsLost = 0;
              }
            }
            host->buffers[0].data = (void *)((long)&header + 4);
            if ((host->headerFlags & 0x8000) == 0) {
              host->buffers[0].dataLength = 2;
            }
            else {
              header._6_2_ = htons((uint16_t)host->serviceTime);
              host->buffers[0].dataLength = 4;
            }
            sStack_50 = 0;
            if (((host->compressor).context != (void *)0x0) &&
               ((host->compressor).compress !=
                (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0)) {
              uVar4 = host->packetSize - 4;
              sVar5 = (*(host->compressor).compress)
                                ((host->compressor).context,host->buffers + 1,host->bufferCount - 1,
                                 uVar4,host->packetData[1],uVar4);
              if ((sVar5 != 0) && (sVar5 < uVar4)) {
                host->headerFlags = host->headerFlags | 0x4000;
                sStack_50 = sVar5;
              }
            }
            if (pEStack_40->outgoingPeerID < 0xfff) {
              host->headerFlags = host->headerFlags | (ushort)pEStack_40->outgoingSessionID << 0xc;
            }
            header._4_2_ = htons(pEStack_40->outgoingPeerID | host->headerFlags);
            if (host->checksum != (ENetChecksumCallback)0x0) {
              peVar6 = (enet_uint32 *)((long)&header + host->buffers[0].dataLength + 4);
              if (pEStack_40->outgoingPeerID < 0xfff) {
                local_84 = pEStack_40->connectID;
              }
              else {
                local_84 = 0;
              }
              *peVar6 = local_84;
              host->buffers[0].dataLength = host->buffers[0].dataLength + 4;
              eVar3 = (*host->checksum)(host->buffers,host->bufferCount);
              *peVar6 = eVar3;
            }
            if (sStack_50 != 0) {
              host->buffers[1].data = host->packetData + 1;
              host->buffers[1].dataLength = sStack_50;
              host->bufferCount = 2;
            }
            pEStack_40->lastSendTime = host->serviceTime;
            iVar1 = enet_socket_send(host->socket,&pEStack_40->address,host->buffers,
                                     host->bufferCount);
            enet_protocol_remove_sent_unreliable_commands(pEStack_40);
            if (iVar1 < 0) {
              return -1;
            }
            host->totalSentData = iVar1 + host->totalSentData;
            host->totalSentPackets = host->totalSentPackets + 1;
          }
        }
        else if ((stack0xffffffffffffffe0 != (ENetEvent *)0x0) &&
                (stack0xffffffffffffffe0->type != ENET_EVENT_TYPE_NONE)) {
          return 1;
        }
      }
    }
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
 
    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
           currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingCommands) ||
              enet_protocol_check_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_check_outgoing_commands (host, currentPeer);
        }

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif

           currentPeer -> packetLossVariance = (currentPeer -> packetLossVariance * 3 + ENET_DIFFERENCE (packetLoss, currentPeer -> packetLoss)) / 4;
           currentPeer -> packetLoss = (currentPeer -> packetLoss * 7 + packetLoss) / 8;

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_16 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}